

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O1

int run_test_udp_alloc_cb_fail(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_udp_t *loop;
  uv_udp_send_t *req_00;
  uv_loop_t *handle;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  uv_udp_t *puVar3;
  code *pcVar4;
  uv_udp_t *puVar5;
  char *pcVar6;
  uv_loop_t *handle_00;
  int in_R8D;
  sockaddr_in addr;
  uv_udp_send_t req;
  uv_buf_t uStack_198;
  uv_loop_t *puStack_188;
  undefined1 auStack_168 [352];
  
  puVar5 = (uv_udp_t *)auStack_168;
  pcVar6 = "0.0.0.0";
  puVar3 = (uv_udp_t *)0x23a3;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)auStack_168);
  if (iVar1 == 0) {
    loop = (uv_udp_t *)uv_default_loop();
    puVar3 = &server;
    iVar1 = uv_udp_init((uv_loop_t *)loop,&server);
    if (iVar1 != 0) goto LAB_00183d75;
    loop = &server;
    iVar1 = uv_udp_bind(&server,(sockaddr *)auStack_168,0);
    if (iVar1 != 0) goto LAB_00183d7a;
    loop = &server;
    pcVar4 = sv_alloc_cb;
    iVar1 = uv_udp_recv_start(&server,sv_alloc_cb,sv_recv_cb);
    puVar5 = (uv_udp_t *)pcVar4;
    if (iVar1 != 0) goto LAB_00183d7f;
    loop = (uv_udp_t *)0x1b4e3a;
    puVar5 = (uv_udp_t *)0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)auStack_168);
    if (iVar1 != 0) goto LAB_00183d84;
    loop = (uv_udp_t *)uv_default_loop();
    puVar5 = &client;
    iVar1 = uv_udp_init((uv_loop_t *)loop,&client);
    if (iVar1 != 0) goto LAB_00183d89;
    auStack_168._16_16_ = (undefined1  [16])uv_buf_init("PING",4);
    puVar5 = &client;
    loop = (uv_udp_t *)(auStack_168 + 0x20);
    in_R8D = (int)auStack_168;
    iVar1 = uv_udp_send((uv_udp_send_t *)loop,&client,(uv_buf_t *)(auStack_168 + 0x10),1,
                        (sockaddr *)auStack_168,cl_send_cb);
    if (iVar1 != 0) goto LAB_00183d8e;
    if (close_cb_called != 0) goto LAB_00183d93;
    if (cl_send_cb_called != 0) goto LAB_00183d98;
    if (cl_recv_cb_called != 0) goto LAB_00183d9d;
    if (sv_send_cb_called != 0) goto LAB_00183da2;
    if (sv_recv_cb_called != 0) goto LAB_00183da7;
    loop = (uv_udp_t *)uv_default_loop();
    puVar5 = (uv_udp_t *)0x0;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (cl_send_cb_called != 1) goto LAB_00183dac;
    if (cl_recv_cb_called != 1) goto LAB_00183db1;
    if (sv_send_cb_called != 1) goto LAB_00183db6;
    if (sv_recv_cb_called != 1) goto LAB_00183dbb;
    if (close_cb_called != 2) goto LAB_00183dc0;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puVar5 = (uv_udp_t *)0x0;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    loop = (uv_udp_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_udp_alloc_cb_fail_cold_1();
    loop = (uv_udp_t *)pcVar6;
LAB_00183d75:
    puVar5 = puVar3;
    run_test_udp_alloc_cb_fail_cold_2();
LAB_00183d7a:
    run_test_udp_alloc_cb_fail_cold_3();
LAB_00183d7f:
    run_test_udp_alloc_cb_fail_cold_4();
LAB_00183d84:
    run_test_udp_alloc_cb_fail_cold_5();
LAB_00183d89:
    run_test_udp_alloc_cb_fail_cold_6();
LAB_00183d8e:
    run_test_udp_alloc_cb_fail_cold_7();
LAB_00183d93:
    run_test_udp_alloc_cb_fail_cold_8();
LAB_00183d98:
    run_test_udp_alloc_cb_fail_cold_9();
LAB_00183d9d:
    run_test_udp_alloc_cb_fail_cold_10();
LAB_00183da2:
    run_test_udp_alloc_cb_fail_cold_11();
LAB_00183da7:
    run_test_udp_alloc_cb_fail_cold_12();
LAB_00183dac:
    run_test_udp_alloc_cb_fail_cold_13();
LAB_00183db1:
    run_test_udp_alloc_cb_fail_cold_14();
LAB_00183db6:
    run_test_udp_alloc_cb_fail_cold_15();
LAB_00183dbb:
    run_test_udp_alloc_cb_fail_cold_16();
LAB_00183dc0:
    run_test_udp_alloc_cb_fail_cold_17();
  }
  run_test_udp_alloc_cb_fail_cold_18();
  handle = (uv_loop_t *)CONCAT71(0x5480,loop == &client || loop == &server);
  if (loop == &client || loop == &server) {
    *extraout_RDX = sv_alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x548160;
  }
  sv_alloc_cb_cold_1();
  puStack_188 = unaff_RBX;
  if ((long)puVar5 < 0) {
    sv_recv_cb_cold_10();
    handle = unaff_RBX;
LAB_00183ee6:
    sv_recv_cb_cold_1();
LAB_00183eeb:
    sv_recv_cb_cold_2();
LAB_00183ef0:
    sv_recv_cb_cold_8();
LAB_00183ef5:
    sv_recv_cb_cold_3();
LAB_00183efa:
    sv_recv_cb_cold_4();
LAB_00183eff:
    sv_recv_cb_cold_5();
LAB_00183f04:
    loop = puVar5;
    sv_recv_cb_cold_7();
LAB_00183f09:
    sv_recv_cb_cold_6();
    puVar5 = loop;
  }
  else {
    if ((uv_loop_t *)puVar5 != (uv_loop_t *)0x0) {
      if (loop != &client && loop != &server) goto LAB_00183ee6;
      if (in_R8D != 0) goto LAB_00183eeb;
      if (handle == (uv_loop_t *)0x0) goto LAB_00183ef0;
      if ((uv_loop_t *)puVar5 != (uv_loop_t *)0x4) goto LAB_00183ef5;
      if (*(int *)*extraout_RDX_00 != 0x474e4950) goto LAB_00183efa;
      iVar1 = uv_udp_recv_stop(loop);
      if (iVar1 != 0) goto LAB_00183eff;
      req_00 = (uv_udp_send_t *)malloc(0x140);
      if (req_00 == (uv_udp_send_t *)0x0) goto LAB_00183f04;
      uStack_198 = uv_buf_init("PONG",4);
      iVar1 = uv_udp_send(req_00,loop,&uStack_198,1,(sockaddr *)handle,sv_send_cb);
      if (iVar1 == 0) {
        sv_recv_cb_called = sv_recv_cb_called + 1;
        return 0;
      }
      goto LAB_00183f09;
    }
    if (handle == (uv_loop_t *)0x0) {
      return extraout_EAX;
    }
  }
  iVar1 = (int)puVar5;
  sv_recv_cb_cold_9();
  if (handle == (uv_loop_t *)0x0) {
    cl_send_cb_cold_4();
LAB_00183f66:
    cl_send_cb_cold_1();
LAB_00183f6b:
    cl_send_cb_cold_2();
  }
  else {
    if (iVar1 != 0) goto LAB_00183f66;
    handle = *(uv_loop_t **)&handle->backend_fd;
    if (handle != (uv_loop_t *)&client && handle != (uv_loop_t *)&server) goto LAB_00183f6b;
    iVar1 = 0x18400a;
    iVar2 = uv_udp_recv_start((uv_udp_t *)handle,cl_alloc_cb,cl_recv_cb);
    if (iVar2 == 0) {
      cl_send_cb_called = cl_send_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  cl_send_cb_cold_3();
  if (handle == (uv_loop_t *)0x0) {
    sv_send_cb_cold_3();
    handle_00 = handle;
  }
  else {
    handle_00 = handle;
    if (iVar1 == 0) {
      handle_00 = *(uv_loop_t **)&handle->backend_fd;
      if (handle_00 == (uv_loop_t *)&client || handle_00 == (uv_loop_t *)&server) {
        uv_close((uv_handle_t *)handle_00,close_cb);
        free(handle);
        sv_send_cb_called = sv_send_cb_called + 1;
        return extraout_EAX_01;
      }
      goto LAB_00183fca;
    }
  }
  sv_send_cb_cold_1();
LAB_00183fca:
  sv_send_cb_cold_2();
  if (handle_00 == (uv_loop_t *)&client || handle_00 == (uv_loop_t *)&server) {
    iVar1 = uv_is_closing((uv_handle_t *)handle_00);
    if (iVar1 == 1) {
      close_cb_called = close_cb_called + 1;
      return extraout_EAX_02;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(udp_alloc_cb_fail) {
  struct sockaddr_in addr;
  uv_udp_send_t req;
  uv_buf_t buf;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, sv_alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_send_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);
  ASSERT(sv_recv_cb_called == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_send_cb_called == 1);
  ASSERT(cl_recv_cb_called == 1);
  ASSERT(sv_send_cb_called == 1);
  ASSERT(sv_recv_cb_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}